

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

ListBuilder * __thiscall
capnp::_::OrphanBuilder::asList
          (ListBuilder *__return_storage_ptr__,OrphanBuilder *this,ElementSize elementSize)

{
  OrphanBuilder *pOVar1;
  ushort uVar2;
  ushort uVar3;
  SegmentId id;
  uint uVar4;
  uint uVar5;
  word *pwVar6;
  ElementSize EVar7;
  SegmentBuilder *this_00;
  SegmentBuilder **ppSVar8;
  int iVar9;
  undefined7 in_register_00000011;
  ulong uVar10;
  ElementSize EVar11;
  char *pcVar12;
  CapTableBuilder *pCVar13;
  char *macroArgs;
  OrphanBuilder *pOVar14;
  OrphanBuilder *pOVar15;
  Fault f;
  char *params;
  Fault local_48;
  uint local_3c;
  CapTableBuilder *local_38;
  
  uVar10 = CONCAT71(in_register_00000011,elementSize) & 0xffffffff;
  EVar11 = (ElementSize)uVar10;
  uVar4 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  if (id.value == 0 && uVar4 == 0) goto LAB_00419dfd;
  this_00 = this->segment;
  pCVar13 = this->capTable;
  if ((uVar4 & 3) == 2) {
    local_3c = (uint)CONCAT71(in_register_00000011,elementSize);
    local_38 = pCVar13;
    this_00 = BuilderArena::getSegment((BuilderArena *)(this_00->super_SegmentReader).arena,id);
    uVar4 = (uint)(this->tag).content;
    pwVar6 = (this_00->super_SegmentReader).ptr.ptr;
    uVar10 = (ulong)(uVar4 & 0xfffffff8);
    pOVar1 = (OrphanBuilder *)((long)&pwVar6->content + uVar10);
    pOVar15 = (OrphanBuilder *)((long)&pwVar6[1].content + uVar10);
    if ((uVar4 & 4) == 0) {
      pOVar14 = (OrphanBuilder *)(&pOVar15->tag + ((int)(pOVar1->tag).content >> 2));
      pOVar15 = pOVar1;
    }
    else {
      this_00 = BuilderArena::getSegment
                          ((BuilderArena *)(this_00->super_SegmentReader).arena,
                           (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
      pOVar14 = (OrphanBuilder *)
                ((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
    }
    uVar10 = (ulong)local_3c;
    pCVar13 = local_38;
  }
  else {
    pOVar14 = (OrphanBuilder *)this->location;
    pOVar15 = this;
  }
  EVar11 = (ElementSize)uVar10;
  if (this_00->readOnly == true) {
    local_38 = pCVar13;
    SegmentBuilder::throwNotWritable(this_00);
    pCVar13 = local_38;
  }
  if (((pOVar15->tag).content & 3) != 1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[68]>
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x4f3,FAILED,"ref->kind() == WirePointer::LIST",
               "\"Called getWritableListPointer() but existing pointer is not a list.\"",
               (char (*) [68])"Called getWritableListPointer() but existing pointer is not a list.")
    ;
    goto LAB_00419df5;
  }
  uVar4 = *(uint *)((long)&(pOVar15->tag).content + 4);
  EVar7 = (ElementSize)uVar4 & INLINE_COMPOSITE;
  if (EVar7 != INLINE_COMPOSITE) {
    uVar5 = *(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)EVar7 * 4);
    if (EVar11 == BIT) {
      if (EVar7 == BIT) {
LAB_00419d84:
        __return_storage_ptr__->segment = this_00;
        __return_storage_ptr__->capTable = pCVar13;
        __return_storage_ptr__->ptr = (byte *)pOVar14;
        __return_storage_ptr__->elementCount = uVar4 >> 3;
        __return_storage_ptr__->step = (uint)(EVar7 == POINTER) * 0x40 + uVar5;
        __return_storage_ptr__->structDataSize = uVar5;
        __return_storage_ptr__->structPointerCount = (ushort)(EVar7 == POINTER);
        __return_storage_ptr__->elementSize = EVar7;
        goto LAB_00419e13;
      }
      params = "Found non-bit list where bit list was expected.";
      pcVar12 = "oldSize == ElementSize::BIT";
      macroArgs = "\"Found non-bit list where bit list was expected.\"";
      iVar9 = 0x538;
    }
    else {
      if (EVar7 != BIT) {
        if (uVar5 < *(uint *)(BITS_PER_ELEMENT_TABLE + (uVar10 & 0xff) * 4)) {
          pcVar12 = "dataSize >= dataBitsPerElement(elementSize) * ELEMENTS";
          iVar9 = 0x541;
        }
        else {
          if ((EVar11 != POINTER) || (EVar7 == POINTER)) goto LAB_00419d84;
          pcVar12 = "pointerCount >= pointersPerElement(elementSize) * ELEMENTS";
          iVar9 = 0x545;
        }
        goto LAB_00419fac;
      }
      params = "Found bit list where non-bit list was expected.";
      pcVar12 = "oldSize != ElementSize::BIT";
      macroArgs = "\"Found bit list where non-bit list was expected.\"";
      iVar9 = 0x53d;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,iVar9,FAILED,pcVar12,macroArgs,(char (*) [48])params);
    goto LAB_00419df5;
  }
  uVar4 = (uint)(pOVar14->tag).content;
  if ((uVar4 & 3) != 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[62]>
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x502,FAILED,"tag->kind() == WirePointer::STRUCT",
               "\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\"",
               (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.");
    kj::_::Debug::Fault::fatal(&local_48);
  }
  ppSVar8 = &pOVar14->segment;
  uVar2 = *(ushort *)((long)&(pOVar14->tag).content + 4);
  uVar3 = *(ushort *)((long)&(pOVar14->tag).content + 6);
  switch((uint)uVar10 & 0xff) {
  case 1:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x510,FAILED,(char *)0x0,
               "\"Found struct list where bit list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
               ,(char (*) [106])
                "Found struct list where bit list was expected; upgrading boolean lists to structs is no longer supported."
              );
    break;
  case 2:
  case 3:
  case 4:
  case 5:
    if ((ulong)uVar2 != 0) goto switchD_00419cd1_default;
    pcVar12 = "dataSize >= ONE * WORDS";
    iVar9 = 0x51a;
LAB_00419fac:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,iVar9,FAILED,pcVar12,"\"Existing list value is incompatible with expected type.\"",
               (char (*) [56])"Existing list value is incompatible with expected type.");
    break;
  case 6:
    if (uVar3 == 0) {
      pcVar12 = "pointerCount >= ONE * POINTERS";
      iVar9 = 0x521;
      goto LAB_00419fac;
    }
    ppSVar8 = ppSVar8 + uVar2;
  default:
switchD_00419cd1_default:
    __return_storage_ptr__->segment = this_00;
    __return_storage_ptr__->capTable = pCVar13;
    __return_storage_ptr__->ptr = (byte *)ppSVar8;
    __return_storage_ptr__->elementCount = uVar4 >> 2 & 0x1fffffff;
    __return_storage_ptr__->step = ((uint)uVar3 + (uint)uVar2) * 0x40;
    __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
    __return_storage_ptr__->structPointerCount = uVar3;
    __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
    pOVar14 = (OrphanBuilder *)(ppSVar8 + -1);
    goto LAB_00419e13;
  case 7:
    kj::_::unreachable();
  }
LAB_00419df5:
  kj::_::Debug::Fault::~Fault(&local_48);
LAB_00419dfd:
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->elementSize = EVar11;
  pOVar14 = (OrphanBuilder *)0x0;
LAB_00419e13:
  this->location = &pOVar14->tag;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder OrphanBuilder::asList(ElementSize elementSize) {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  ListBuilder result = WireHelpers::getWritableListPointer(
      tagAsPtr(), location, segment, capTable, elementSize, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  // (Actually, currently this is not true for primitive lists, but let's not turn into a bug if
  // it changes!)
  location = result.getLocation();

  return result;
}